

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_swizzle_expression_abi_cxx11_(CompilerMSL *this,uint32_t id)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRCombinedImageSampler *pSVar3;
  long lVar4;
  reference pcVar5;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  string local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> array_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> image_expr;
  char *c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  size_type index;
  undefined1 local_48 [8];
  string expr;
  SPIRCombinedImageSampler *combined;
  uint32_t id_local;
  CompilerMSL *this_local;
  
  pSVar3 = Compiler::maybe_get<spirv_cross::SPIRCombinedImageSampler>
                     ((Compiler *)CONCAT44(in_register_00000034,id),in_EDX);
  if (pSVar3 == (SPIRCombinedImageSampler *)0x0) {
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&index + 4),in_EDX);
  }
  else {
    index._4_4_ = (pSVar3->image).id;
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&index + 4));
  CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_48,id,SUB41(uVar2,0));
  lVar4 = ::std::__cxx11::string::find_first_of((char)local_48,0x5b);
  __end1._M_current = (char *)::std::__cxx11::string::begin();
  c = (char *)::std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&c);
    if (!bVar1) break;
    pcVar5 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    if (*pcVar5 == '.') {
      *pcVar5 = '_';
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  if (lVar4 == -1) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  else {
    ::std::__cxx11::string::substr((ulong)local_a8,(ulong)local_48);
    ::std::__cxx11::string::substr((ulong)local_c8,(ulong)local_48);
    ::std::operator+(local_e8,local_a8);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     local_e8);
    ::std::__cxx11::string::~string((string *)local_e8);
    ::std::__cxx11::string::~string(local_c8);
    ::std::__cxx11::string::~string((string *)local_a8);
  }
  ::std::__cxx11::string::~string((string *)local_48);
  return this;
}

Assistant:

string CompilerMSL::to_swizzle_expression(uint32_t id)
{
	auto *combined = maybe_get<SPIRCombinedImageSampler>(id);

	auto expr = to_expression(combined ? combined->image : VariableID(id));
	auto index = expr.find_first_of('[');

	// If an image is part of an argument buffer translate this to a legal identifier.
	for (auto &c : expr)
		if (c == '.')
			c = '_';

	if (index == string::npos)
		return expr + swizzle_name_suffix;
	else
	{
		auto image_expr = expr.substr(0, index);
		auto array_expr = expr.substr(index);
		return image_expr + swizzle_name_suffix + array_expr;
	}
}